

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O1

Aig_Man_t *
Fra_FraigLatchCorrespondence
          (Aig_Man_t *pAig,int nFramesP,int nConfMax,int fProve,int fVerbose,int *pnIter,
          float TimeLimit)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *vPart;
  void *__ptr;
  int iVar3;
  uint uVar4;
  Aig_Man_t *pAVar5;
  Fra_Sml_t *p;
  Abc_Cex_t *pAVar6;
  Fra_Lcr_t *pLcr;
  Fra_Man_t *pFVar7;
  Fra_Cla_t *pFVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Man_t *pAVar10;
  void **ppvVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  timespec ts;
  timespec local_88;
  int local_74;
  uint local_70;
  float local_6c;
  Aig_Man_t *local_68;
  int local_5c;
  Fra_Man_t *local_58;
  long local_50;
  long local_48;
  long local_40;
  uint *local_38;
  
  local_74 = fVerbose;
  local_6c = TimeLimit;
  local_5c = nConfMax;
  iVar3 = clock_gettime(3,&local_88);
  if (iVar3 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_88.tv_sec * -1000000;
  }
  if ((local_6c != 0.0) || (NAN(local_6c))) {
    iVar3 = clock_gettime(3,&local_88);
    if (iVar3 < 0) {
      fVar16 = -1.0;
    }
    else {
      fVar16 = (float)(local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000);
    }
    local_48 = (long)(local_6c * 1e+06 + fVar16);
  }
  else {
    local_48 = 0;
  }
  if (pAig->nObjs[6] + pAig->nObjs[5] == 0) {
    if (pnIter != (int *)0x0) {
      *pnIter = 0;
    }
    Aig_ManReprStart(pAig,pAig->vObjs->nSize);
    pAVar5 = Aig_ManDupOrdered(pAig);
  }
  else {
    if (pAig->nRegs < 1) {
      __assert_fail("Aig_ManRegNum(pAig) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraLcr.c"
                    ,0x226,
                    "Aig_Man_t *Fra_FraigLatchCorrespondence(Aig_Man_t *, int, int, int, int, int *, float)"
                   );
    }
    local_40 = lVar12;
    iVar3 = clock_gettime(3,&local_88);
    if (iVar3 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    if (local_74 != 0) {
      printf("Simulating AIG with %d nodes for %d cycles ...  ",
             (ulong)(uint)(pAig->nObjs[6] + pAig->nObjs[5]),(ulong)(nFramesP + 0x20));
    }
    pAVar5 = pAig;
    p = Fra_SmlSimulateSeq(pAig,nFramesP,0x20,1,1);
    if (local_74 != 0) {
      Abc_Print((int)pAVar5,"%s =","Time");
      iVar14 = 3;
      iVar3 = clock_gettime(3,&local_88);
      if (iVar3 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar13 - lVar12) / 1000000.0);
    }
    local_68 = pAig;
    iVar3 = clock_gettime(3,&local_88);
    pAVar5 = local_68;
    if (iVar3 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    if ((fProve == 0) || (p->fNonConstOut == 0)) {
      local_38 = (uint *)pnIter;
      pLcr = Lcr_ManAlloc(local_68);
      pLcr->nFramesP = nFramesP;
      pLcr->fVerbose = local_74;
      pLcr->timeSim = pLcr->timeSim + (lVar13 - lVar12);
      pFVar7 = Fra_LcrAigPrepare(pAVar5);
      pFVar7->pBmc = (Fra_Bmc_t *)pLcr;
      pFVar7->pSml = p;
      pFVar8 = Fra_ClassesStart(pLcr->pAig);
      pLcr->pCla = pFVar8;
      pFVar7->pCla = pFVar8;
      Fra_ClassesPrepare(pFVar8,1,0);
      pFVar8 = pLcr->pCla;
      pFVar8->pFuncNodeIsConst = Fra_LcrNodeIsConst;
      pFVar8->pFuncNodesAreEqual = Fra_LcrNodesAreEqual;
      local_58 = pFVar7;
      Fra_SmlStop(pFVar7->pSml);
      iVar3 = clock_gettime(3,&local_88);
      if (iVar3 < 0) {
        lVar12 = -1;
      }
      else {
        lVar12 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      if (local_74 != 0) {
        printf("Partitioning AIG ...  ");
      }
      pAVar5 = Fra_LcrDeriveAigForPartitioning(pLcr);
      pVVar9 = Aig_ManPartitionSmart(pAVar5,200,0,(Vec_Ptr_t **)0x0);
      pLcr->vParts = pVVar9;
      Fra_LcrRemapPartitions(pVVar9,pLcr->pCla,pLcr->pInToOutPart,pLcr->pInToOutNum);
      Aig_ManStop(pAVar5);
      if (local_74 != 0) {
        Abc_Print((int)pAVar5,"%s =","Time");
        iVar14 = 3;
        iVar3 = clock_gettime(3,&local_88);
        lVar15 = -1;
        lVar13 = -1;
        if (-1 < iVar3) {
          lVar13 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
        }
        Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar13 - lVar12) / 1000000.0);
        iVar3 = clock_gettime(3,&local_88);
        if (-1 < iVar3) {
          lVar15 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
        }
        pLcr->timePart = pLcr->timePart + (lVar15 - lVar12);
      }
      iVar3 = Fra_ClassesCountLits(pLcr->pCla);
      pLcr->nLitsBeg = iVar3;
      pAVar5 = pLcr->pAig;
      pLcr->nNodesBeg = pAVar5->nObjs[6] + pAVar5->nObjs[5];
      pLcr->nRegsBeg = pAVar5->nRegs;
      pLcr->fRefining = 1;
      local_70 = 0;
      do {
        pLcr->fRefining = 0;
        iVar3 = clock_gettime(3,&local_88);
        if (iVar3 < 0) {
          local_50 = 1;
        }
        else {
          lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
          local_50 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_88.tv_sec * -1000000;
        }
        Fra_ClassNodesMark(pLcr);
        pLcr->vFraigs->nSize = 0;
        pVVar9 = pLcr->vParts;
        if (0 < pVVar9->nSize) {
          lVar12 = 0;
          do {
            vPart = (Vec_Int_t *)pVVar9->pArray[lVar12];
            if ((local_6c != 0.0) || (NAN(local_6c))) {
              iVar3 = clock_gettime(3,&local_88);
              if (iVar3 < 0) {
                lVar13 = -1;
              }
              else {
                lVar13 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
              }
              if (lVar13 <= local_48) goto LAB_005ffb59;
              pVVar9 = pLcr->vFraigs;
              if (0 < pVVar9->nSize) {
                lVar12 = 0;
                do {
                  Aig_ManStop((Aig_Man_t *)pVVar9->pArray[lVar12]);
                  lVar12 = lVar12 + 1;
                  pVVar9 = pLcr->vFraigs;
                } while (lVar12 < pVVar9->nSize);
              }
              pAVar5 = local_68;
              Aig_ManCleanMarkA(local_68);
              Aig_ManCleanMarkB(pAVar5);
              puts("Fra_FraigLatchCorrespondence(): Runtime limit exceeded.");
              pAVar5 = (Aig_Man_t *)0x0;
              goto LAB_00600058;
            }
LAB_005ffb59:
            iVar3 = clock_gettime(3,&local_88);
            if (iVar3 < 0) {
              lVar13 = 1;
            }
            else {
              lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
              lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_88.tv_sec * -1000000;
            }
            pAVar5 = Fra_LcrCreatePart(pLcr,vPart);
            iVar3 = clock_gettime(3,&local_88);
            if (iVar3 < 0) {
              lVar15 = -1;
            }
            else {
              lVar15 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
            }
            pLcr->timeTrav = pLcr->timeTrav + lVar15 + lVar13;
            iVar3 = clock_gettime(3,&local_88);
            if (iVar3 < 0) {
              lVar13 = 1;
            }
            else {
              lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
              lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_88.tv_sec * -1000000;
            }
            pAVar10 = Fra_FraigEquivence(pAVar5,local_5c,0);
            iVar3 = clock_gettime(3,&local_88);
            if (iVar3 < 0) {
              lVar15 = -1;
            }
            else {
              lVar15 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
            }
            pLcr->timeFraig = pLcr->timeFraig + lVar15 + lVar13;
            pVVar9 = pLcr->vFraigs;
            uVar1 = pVVar9->nCap;
            if (pVVar9->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc(0x80);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar9->pArray,0x80);
                }
                pVVar9->pArray = ppvVar11;
                iVar3 = 0x10;
              }
              else {
                iVar3 = uVar1 * 2;
                if (iVar3 <= (int)uVar1) goto LAB_005ffd01;
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar9->pArray,(ulong)uVar1 << 4);
                }
                pVVar9->pArray = ppvVar11;
              }
              pVVar9->nCap = iVar3;
            }
LAB_005ffd01:
            iVar3 = pVVar9->nSize;
            pVVar9->nSize = iVar3 + 1;
            pVVar9->pArray[iVar3] = pAVar10;
            Aig_ManStop(pAVar5);
            lVar12 = lVar12 + 1;
            pVVar9 = pLcr->vParts;
          } while (lVar12 < pVVar9->nSize);
        }
        Fra_ClassNodesUnmark(pLcr);
        if (local_74 != 0) {
          pFVar8 = pLcr->pCla;
          uVar1 = pFVar8->vClasses1->nSize;
          uVar2 = pFVar8->vClasses->nSize;
          uVar4 = Fra_ClassesCountLits(pFVar8);
          iVar3 = 0x9627c2;
          printf("%3d : Const = %6d. Class = %6d.  L = %6d. Part = %3d.  ",(ulong)local_70,
                 (ulong)uVar1,(ulong)uVar2,(ulong)uVar4,(ulong)(uint)pLcr->vParts->nSize);
          Abc_Print(iVar3,"%s =","T");
          iVar14 = 3;
          iVar3 = clock_gettime(3,&local_88);
          if (iVar3 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
          }
          Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar12 + local_50) / 1000000.0);
        }
        pAVar5 = pLcr->pAig;
        pVVar9 = pAVar5->vCis;
        if (0 < pVVar9->nSize) {
          lVar12 = 0;
          do {
            *(Fra_Man_t **)((long)pVVar9->pArray[lVar12] + 0x28) = local_58;
            lVar12 = lVar12 + 1;
            pVVar9 = pAVar5->vCis;
          } while (lVar12 < pVVar9->nSize);
        }
        iVar3 = Fra_ClassesRefine(pLcr->pCla);
        if (iVar3 != 0) {
          pLcr->fRefining = 1;
        }
        iVar3 = Fra_ClassesRefine1(pLcr->pCla,0,(int *)0x0);
        if (iVar3 != 0) {
          pLcr->fRefining = 1;
        }
        pVVar9 = pLcr->vFraigs;
        if (0 < pVVar9->nSize) {
          lVar12 = 0;
          do {
            Aig_ManStop((Aig_Man_t *)pVVar9->pArray[lVar12]);
            lVar12 = lVar12 + 1;
            pVVar9 = pLcr->vFraigs;
          } while (lVar12 < pVVar9->nSize);
        }
        iVar3 = clock_gettime(3,&local_88);
        if (iVar3 < 0) {
          lVar12 = 1;
        }
        else {
          lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
          lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_88.tv_sec * -1000000;
        }
        pVVar9 = pLcr->vParts;
        if (0 < pVVar9->nSize) {
          lVar13 = 0;
          do {
            __ptr = pVVar9->pArray[lVar13];
            if (__ptr != (void *)0x0) {
              if (*(void **)((long)__ptr + 8) != (void *)0x0) {
                free(*(void **)((long)__ptr + 8));
                *(undefined8 *)((long)__ptr + 8) = 0;
              }
              free(__ptr);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < pVVar9->nSize);
        }
        if (pVVar9->pArray != (void **)0x0) {
          free(pVVar9->pArray);
          pVVar9->pArray = (void **)0x0;
        }
        if (pVVar9 != (Vec_Ptr_t *)0x0) {
          free(pVVar9);
        }
        pAVar5 = Fra_LcrDeriveAigForPartitioning(pLcr);
        pVVar9 = Aig_ManPartitionSmart(pAVar5,200,0,(Vec_Ptr_t **)0x0);
        pLcr->vParts = pVVar9;
        Fra_LcrRemapPartitions(pVVar9,pLcr->pCla,pLcr->pInToOutPart,pLcr->pInToOutNum);
        Aig_ManStop(pAVar5);
        iVar3 = clock_gettime(3,&local_88);
        if (iVar3 < 0) {
          lVar13 = -1;
        }
        else {
          lVar13 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
        }
        pLcr->timePart = pLcr->timePart + lVar13 + lVar12;
        local_70 = local_70 + 1;
      } while (pLcr->fRefining != 0);
      pLcr->nIters = local_70;
      iVar3 = clock_gettime(3,&local_88);
      if (iVar3 < 0) {
        lVar12 = 1;
      }
      else {
        lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
        lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_88.tv_sec * -1000000;
      }
      Fra_ClassesCopyReprs(pLcr->pCla,(Vec_Ptr_t *)0x0);
      pAVar5 = Aig_ManDupRepr(pLcr->pAig,0);
      Aig_ManSeqCleanup(pAVar5);
      iVar3 = clock_gettime(3,&local_88);
      lVar15 = -1;
      lVar13 = -1;
      if (-1 < iVar3) {
        lVar13 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      pLcr->timeUpdate = pLcr->timeUpdate + lVar13 + lVar12;
      iVar3 = clock_gettime(3,&local_88);
      if (-1 < iVar3) {
        lVar15 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      pLcr->timeTotal = lVar15 + local_40;
      iVar3 = Fra_ClassesCountLits(pLcr->pCla);
      pLcr->nLitsEnd = iVar3;
      pLcr->nNodesEnd = pAVar5->nObjs[6] + pAVar5->nObjs[5];
      pLcr->nRegsEnd = pAVar5->nRegs;
LAB_00600058:
      if (local_58 != (Fra_Man_t *)0x0) {
        free(local_58);
      }
      Lcr_ManFree(pLcr);
      if (local_38 != (uint *)0x0) {
        *local_38 = local_70;
      }
    }
    else {
      pAVar6 = Fra_SmlGetCounterExample(p);
      local_68->pSeqModel = pAVar6;
      Fra_SmlStop(p);
      pAVar5 = (Aig_Man_t *)0x0;
    }
  }
  return pAVar5;
}

Assistant:

Aig_Man_t * Fra_FraigLatchCorrespondence( Aig_Man_t * pAig, int nFramesP, int nConfMax, int fProve, int fVerbose, int * pnIter, float TimeLimit )
{
    int nPartSize    = 200;
    int fReprSelect  = 0;
    Fra_Lcr_t * p;
    Fra_Sml_t * pSml;
    Fra_Man_t * pTemp;
    Aig_Man_t * pAigPart, * pAigTemp, * pAigNew = NULL;
    Vec_Int_t * vPart;
    int i, nIter;
    abctime timeSim, clk2, clk3, clk = Abc_Clock();
    abctime TimeToStop = TimeLimit ? TimeLimit * CLOCKS_PER_SEC + Abc_Clock() : 0;
    if ( Aig_ManNodeNum(pAig) == 0 )
    {
        if ( pnIter ) *pnIter = 0;
        // Ntl_ManFinalize() requires the following to satisfy an assertion.
        Aig_ManReprStart(pAig,Aig_ManObjNumMax(pAig));
        return Aig_ManDupOrdered(pAig);
    }
    assert( Aig_ManRegNum(pAig) > 0 ); 

    // simulate the AIG 
clk2 = Abc_Clock();
if ( fVerbose )
printf( "Simulating AIG with %d nodes for %d cycles ...  ", Aig_ManNodeNum(pAig), nFramesP + 32 );
    pSml = Fra_SmlSimulateSeq( pAig, nFramesP, 32, 1, 1  ); 
if ( fVerbose ) 
{
ABC_PRT( "Time", Abc_Clock() - clk2 );
}
timeSim = Abc_Clock() - clk2;

    // check if simulation discovered non-constant-0 POs
    if ( fProve && pSml->fNonConstOut )
    {
        pAig->pSeqModel = Fra_SmlGetCounterExample( pSml );
        Fra_SmlStop( pSml );
        return NULL;
    }

    // start the manager
    p = Lcr_ManAlloc( pAig );
    p->nFramesP = nFramesP;
    p->fVerbose = fVerbose;
    p->timeSim += timeSim;

    pTemp = Fra_LcrAigPrepare( pAig );
    pTemp->pBmc = (Fra_Bmc_t *)p;
    pTemp->pSml = pSml;

    // get preliminary info about equivalence classes
    pTemp->pCla = p->pCla = Fra_ClassesStart( p->pAig );
    Fra_ClassesPrepare( p->pCla, 1, 0 );
    p->pCla->pFuncNodeIsConst   = Fra_LcrNodeIsConst;
    p->pCla->pFuncNodesAreEqual = Fra_LcrNodesAreEqual;
    Fra_SmlStop( pTemp->pSml );

    // partition the AIG for latch correspondence computation
clk2 = Abc_Clock();
if ( fVerbose )
printf( "Partitioning AIG ...  " );
    pAigPart = Fra_LcrDeriveAigForPartitioning( p );
    p->vParts = (Vec_Ptr_t *)Aig_ManPartitionSmart( pAigPart, nPartSize, 0, NULL );
    Fra_LcrRemapPartitions( p->vParts, p->pCla, p->pInToOutPart, p->pInToOutNum );
    Aig_ManStop( pAigPart );
if ( fVerbose ) 
{
ABC_PRT( "Time", Abc_Clock() - clk2 );
p->timePart += Abc_Clock() - clk2;
}

    // get the initial stats
    p->nLitsBeg  = Fra_ClassesCountLits( p->pCla );
    p->nNodesBeg = Aig_ManNodeNum(p->pAig);
    p->nRegsBeg  = Aig_ManRegNum(p->pAig);

    // perforn interative reduction of the partitions
    p->fRefining = 1;
    for ( nIter = 0; p->fRefining; nIter++ )
    {
        p->fRefining = 0;
        clk3 = Abc_Clock();
        // derive AIGs for each partition
        Fra_ClassNodesMark( p );
        Vec_PtrClear( p->vFraigs );
        Vec_PtrForEachEntry( Vec_Int_t *, p->vParts, vPart, i )
        {
            if ( TimeLimit != 0.0 && Abc_Clock() > TimeToStop )
            {
                Vec_PtrForEachEntry( Aig_Man_t *, p->vFraigs, pAigPart, i )
                    Aig_ManStop( pAigPart );
                Aig_ManCleanMarkA( pAig );
                Aig_ManCleanMarkB( pAig );
                printf( "Fra_FraigLatchCorrespondence(): Runtime limit exceeded.\n" );
                goto finish;
            }
clk2 = Abc_Clock();
            pAigPart = Fra_LcrCreatePart( p, vPart );
p->timeTrav += Abc_Clock() - clk2;
clk2 = Abc_Clock();
            pAigTemp  = Fra_FraigEquivence( pAigPart, nConfMax, 0 );
p->timeFraig += Abc_Clock() - clk2;
            Vec_PtrPush( p->vFraigs, pAigTemp );
/*
            {
                char Name[1000];
                sprintf( Name, "part%04d.blif", i );
                Aig_ManDumpBlif( pAigPart, Name, NULL, NULL );
            }
printf( "Finished part %4d (out of %4d).  ", i, Vec_PtrSize(p->vParts) );
ABC_PRT( "Time", Abc_Clock() - clk3 );
*/

            Aig_ManStop( pAigPart );
        }
        Fra_ClassNodesUnmark( p );
        // report the intermediate results
        if ( fVerbose )
        {
            printf( "%3d : Const = %6d. Class = %6d.  L = %6d. Part = %3d.  ", 
                nIter, Vec_PtrSize(p->pCla->vClasses1), Vec_PtrSize(p->pCla->vClasses), 
                Fra_ClassesCountLits(p->pCla), Vec_PtrSize(p->vParts) );
            ABC_PRT( "T", Abc_Clock() - clk3 );
        }
        // refine the classes
        Fra_LcrAigPrepareTwo( p->pAig, pTemp );
        if ( Fra_ClassesRefine( p->pCla ) )
            p->fRefining = 1;
        if ( Fra_ClassesRefine1( p->pCla, 0, NULL ) )
            p->fRefining = 1;
        // clean the fraigs
        Vec_PtrForEachEntry( Aig_Man_t *, p->vFraigs, pAigPart, i )
            Aig_ManStop( pAigPart );

        // repartition if needed
        if ( 1 )
        {
clk2 = Abc_Clock();
            Vec_VecFree( (Vec_Vec_t *)p->vParts );
            pAigPart = Fra_LcrDeriveAigForPartitioning( p );
            p->vParts = (Vec_Ptr_t *)Aig_ManPartitionSmart( pAigPart, nPartSize, 0, NULL );
            Fra_LcrRemapPartitions( p->vParts, p->pCla, p->pInToOutPart, p->pInToOutNum );
            Aig_ManStop( pAigPart );
p->timePart += Abc_Clock() - clk2;
        }
    }
    p->nIters = nIter;

    // move the classes into representatives and reduce AIG
clk2 = Abc_Clock();
//    Fra_ClassesPrint( p->pCla, 1 );
    if ( fReprSelect )
        Fra_ClassesSelectRepr( p->pCla );
    Fra_ClassesCopyReprs( p->pCla, NULL );
    pAigNew = Aig_ManDupRepr( p->pAig, 0 );
    Aig_ManSeqCleanup( pAigNew );
//    Aig_ManCountMergeRegs( pAigNew );
p->timeUpdate += Abc_Clock() - clk2;
p->timeTotal = Abc_Clock() - clk;
    // get the final stats
    p->nLitsEnd  = Fra_ClassesCountLits( p->pCla );
    p->nNodesEnd = Aig_ManNodeNum(pAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pAigNew);
finish:
    ABC_FREE( pTemp );
    Lcr_ManFree( p );
    if ( pnIter ) *pnIter = nIter;
    return pAigNew;
}